

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Production * lookup_production(Grammar *g,char *name,uint l)

{
  Production **ppPVar1;
  Production *pPVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Production *unaff_R15;
  bool bVar6;
  
  uVar4 = (ulong)(g->productions).n;
  if (uVar4 != 0) {
    ppPVar1 = (g->productions).v;
    uVar5 = 0;
    do {
      pPVar2 = ppPVar1[uVar5];
      bVar6 = true;
      if (pPVar2->name_len == l) {
        iVar3 = strncmp(pPVar2->name,name,(ulong)l);
        bVar6 = iVar3 != 0;
        if (!bVar6) {
          unaff_R15 = pPVar2;
        }
      }
      if (!bVar6) {
        return unaff_R15;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return (Production *)0x0;
}

Assistant:

Production *lookup_production(Grammar *g, char *name, uint l) {
  uint i;

  for (i = 0; i < g->productions.n; i++) {
    Production *pp = g->productions.v[i];
    if (pp->name_len != l || strncmp(pp->name, name, l)) continue;
    return pp;
  }
  return NULL;
}